

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue js_call_bound_function
                  (JSContext *ctx,JSValue func_obj,JSValue this_obj,int argc,JSValue *argv,int flags
                  )

{
  undefined8 *puVar1;
  uint uVar2;
  JSValueUnion *pJVar3;
  undefined8 uVar4;
  void *pvVar5;
  BOOL BVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  int iVar11;
  undefined8 *puVar12;
  JSValueUnion JVar13;
  JSValue JVar14;
  JSValue JVar15;
  long lStack_70;
  JSValueUnion aJStack_68 [2];
  long lStack_58;
  int aiStack_50 [2];
  undefined8 local_48;
  undefined8 uStack_40;
  int local_34;
  
  pJVar3 = *(JSValueUnion **)((long)func_obj.u.ptr + 0x30);
  uVar2 = pJVar3[4].int32;
  uVar7 = (ulong)uVar2;
  iVar11 = uVar2 + argc;
  lVar10 = (long)iVar11;
  if (&stack0xfffffffffffffff8 + lVar10 * -0x10 < (undefined1 *)ctx->rt->stack_limit) {
    aiStack_50[0] = 0x116c37;
    aiStack_50[1] = 0;
    JS_ThrowInternalError(ctx,"stack overflow");
    JVar14 = (JSValue)(ZEXT816(6) << 0x40);
  }
  else {
    puVar12 = &local_48 + lVar10 * -2;
    if (0 < (int)uVar2) {
      lVar8 = 0;
      uVar9 = 0;
      do {
        puVar1 = (undefined8 *)((long)pJVar3 + lVar8 + 0x28);
        uVar4 = puVar1[1];
        *(undefined8 *)((long)puVar12 + lVar8) = *puVar1;
        ((undefined8 *)((long)puVar12 + lVar8))[1] = uVar4;
        uVar9 = uVar9 + 1;
        lVar8 = lVar8 + 0x10;
      } while (uVar9 < uVar7);
    }
    if (0 < argc) {
      lVar8 = 0;
      do {
        puVar1 = (undefined8 *)((long)&argv->u + lVar8);
        uVar4 = puVar1[1];
        puVar12[(long)(int)uVar7 * 2] = *puVar1;
        (puVar12 + (long)(int)uVar7 * 2)[1] = uVar4;
        uVar7 = (ulong)((int)uVar7 + 1);
        lVar8 = lVar8 + 0x10;
      } while ((ulong)(uint)argc << 4 != lVar8);
    }
    if ((flags & 1U) == 0) {
      JVar14 = *(JSValue *)pJVar3;
      JVar15 = *(JSValue *)(pJVar3 + 2);
      local_48._0_4_ = 0;
      uStack_40 = 3;
      aJStack_68[lVar10 * -2].ptr = (void *)((ulong)local_48._4_4_ << 0x20);
      aJStack_68[lVar10 * 0xfffffffffffffffeU + 1] = (JSValueUnion)0x3;
      (&lStack_58)[lVar10 * -2] = (long)puVar12;
      aiStack_50[lVar10 * -4] = 2;
      (&lStack_70)[lVar10 * -2] = 0x116cf4;
      JVar14 = JS_CallInternal(ctx,JVar14,JVar15,*(JSValue *)(aJStack_68 + lVar10 * -2),iVar11,
                               (JSValue *)(&lStack_58)[lVar10 * -2],aiStack_50[lVar10 * -4]);
    }
    else {
      local_34 = iVar11;
      (aiStack_50 + lVar10 * -4)[0] = 0x116d0c;
      (aiStack_50 + lVar10 * -4)[1] = 0;
      BVar6 = js_same_value(ctx,func_obj,this_obj);
      iVar11 = local_34;
      JVar14 = *(JSValue *)pJVar3;
      JVar13 = this_obj.u;
      pvVar5 = (void *)this_obj.tag;
      if (BVar6 != 0) {
        JVar13.ptr = pJVar3->ptr;
        pvVar5 = pJVar3[1].ptr;
      }
      (aiStack_50 + lVar10 * -4)[0] = 2;
      (aiStack_50 + lVar10 * -4)[1] = 0;
      (&lStack_58)[lVar10 * -2] = (long)puVar12;
      aJStack_68[lVar10 * 0xfffffffffffffffeU + 1] = (JSValueUnion)0x116d33;
      JVar15.tag = (int64_t)pvVar5;
      JVar15.u.float64 = JVar13.float64;
      JVar14 = JS_CallConstructorInternal
                         (ctx,JVar14,JVar15,iVar11,(JSValue *)(&lStack_58)[lVar10 * -2],
                          aiStack_50[lVar10 * -4]);
    }
  }
  return JVar14;
}

Assistant:

static JSValue js_call_bound_function(JSContext *ctx, JSValueConst func_obj,
                                      JSValueConst this_obj,
                                      int argc, JSValueConst *argv, int flags)
{
    JSObject *p;
    JSBoundFunction *bf;
    JSValueConst *arg_buf, new_target;
    int arg_count, i;

    p = JS_VALUE_GET_OBJ(func_obj);
    bf = p->u.bound_function;
    arg_count = bf->argc + argc;
    if (js_check_stack_overflow(ctx->rt, sizeof(JSValue) * arg_count))
        return JS_ThrowStackOverflow(ctx);
    arg_buf = alloca(sizeof(JSValue) * arg_count);
    for(i = 0; i < bf->argc; i++) {
        arg_buf[i] = bf->argv[i];
    }
    for(i = 0; i < argc; i++) {
        arg_buf[bf->argc + i] = argv[i];
    }
    if (flags & JS_CALL_FLAG_CONSTRUCTOR) {
        new_target = this_obj;
        if (js_same_value(ctx, func_obj, new_target))
            new_target = bf->func_obj;
        return JS_CallConstructor2(ctx, bf->func_obj, new_target,
                                   arg_count, arg_buf);
    } else {
        return JS_Call(ctx, bf->func_obj, bf->this_val,
                       arg_count, arg_buf);
    }
}